

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O1

Mesh * eos::morphablemodel::sample_to_mesh
                 (Mesh *__return_storage_ptr__,VectorXf *shape_instance,VectorXf *color_instance,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tvi,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tci,
                 vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 *texture_coordinates,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                 *texture_triangle_indices)

{
  double dVar1;
  pointer paVar2;
  long lVar3;
  float *pfVar4;
  undefined8 uVar5;
  pointer pMVar6;
  pointer pMVar7;
  long lVar8;
  long lVar9;
  size_type sVar10;
  ulong uVar11;
  pointer paVar12;
  size_type __new_size;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  lVar9 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  lVar8 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (lVar8 != 0 && lVar9 != lVar8) {
    __assert_fail("shape_instance.rows() == color_instance.rows() || color_instance.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x25c,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  paVar12 = (texture_coordinates->
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  paVar2 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (((paVar12 != paVar2) && ((long)paVar12 - (long)paVar2 >> 4 != lVar9 / 3)) &&
     ((texture_triangle_indices->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (texture_triangle_indices->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    __assert_fail("texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) || !texture_triangle_indices .empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x261,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  __new_size = lVar9 / 3;
  memset(__return_storage_ptr__,0,0x90);
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::resize(&__return_storage_ptr__->vertices,__new_size);
  if (2 < lVar9) {
    lVar8 = 1;
    sVar10 = __new_size;
    do {
      lVar3 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows;
      if (((lVar3 <= lVar8 + -1) || (lVar3 <= lVar8)) || (lVar3 <= lVar8 + 1)) goto LAB_0015b140;
      pfVar4 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      uVar5 = *(undefined8 *)(pfVar4 + lVar8);
      pMVar6 = (__return_storage_ptr__->vertices).
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(float *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                        m_storage + lVar8 * 4 + -4) = pfVar4[lVar8 + -1];
      *(undefined8 *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage +
       lVar8 * 4) = uVar5;
      lVar8 = lVar8 + 3;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  if (0 < (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows) {
    std::
    vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
    ::resize(&__return_storage_ptr__->colors,__new_size);
    if (2 < lVar9) {
      lVar9 = 1;
      do {
        lVar8 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows;
        if (((lVar8 <= lVar9 + -1) || (lVar8 <= lVar9)) || (lVar8 <= lVar9 + 1)) {
LAB_0015b140:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
                       );
        }
        pfVar4 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        uVar14 = 0;
        uVar13 = 0;
        if (0.0 <= pfVar4[lVar9 + -1]) {
          uVar13 = -(uint)(1.0 < pfVar4[lVar9 + -1]);
          uVar13 = uVar13 & 0x3f800000 | ~uVar13 & (uint)pfVar4[lVar9 + -1];
        }
        if (0.0 <= pfVar4[lVar9]) {
          uVar14 = -(uint)(1.0 < pfVar4[lVar9]);
          uVar14 = uVar14 & 0x3f800000 | ~uVar14 & (uint)pfVar4[lVar9];
        }
        uVar15 = 0;
        if (0.0 <= pfVar4[lVar9 + 1]) {
          uVar15 = -(uint)(1.0 < pfVar4[lVar9 + 1]);
          uVar15 = uVar15 & 0x3f800000 | ~uVar15 & (uint)pfVar4[lVar9 + 1];
        }
        pMVar6 = (__return_storage_ptr__->colors).
                 super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(uint *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar9 * 4 + -4) = uVar13;
        *(uint *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar9 * 4) = uVar14;
        *(uint *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar9 * 4 + 4) = uVar15;
        lVar9 = lVar9 + 3;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tvi,tvi);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tci,tci);
  paVar12 = (texture_coordinates->
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (paVar12 != paVar2) {
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::resize(&__return_storage_ptr__->texcoords,(long)paVar2 - (long)paVar12 >> 4);
    paVar12 = (texture_coordinates->
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((texture_coordinates->
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != paVar12) {
      lVar9 = 4;
      uVar11 = 0;
      do {
        dVar1 = *(double *)((long)paVar12->_M_elems + lVar9 * 2);
        pMVar7 = (__return_storage_ptr__->texcoords).
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).
                          m_storage.m_data + lVar9 + -4) =
             (float)*(double *)((long)paVar12->_M_elems + lVar9 * 2 + -8);
        *(float *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).
                          m_storage.m_data + lVar9) = (float)dVar1;
        uVar11 = uVar11 + 1;
        paVar12 = (texture_coordinates->
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 8;
      } while (uVar11 < (ulong)((long)(texture_coordinates->
                                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar12 >>
                               4));
    }
    if ((texture_triangle_indices->
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (texture_triangle_indices->
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
                (&__return_storage_ptr__->tti,texture_triangle_indices);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline core::Mesh sample_to_mesh(
    const Eigen::VectorXf& shape_instance, const Eigen::VectorXf& color_instance,
    const std::vector<std::array<int, 3>>& tvi, const std::vector<std::array<int, 3>>& tci,
    const std::vector<std::array<double, 2>>&
        texture_coordinates /* = std::vector<std::array<double, 2>>() */,
    const std::vector<std::array<int, 3>>& texture_triangle_indices /* = std::vector<std::array<int, 3>>() */)
{
    assert(shape_instance.rows() == color_instance.rows() ||
           color_instance.size() == 0); // The number of vertices (= model.getDataDimension() / 3) has to be
                                        // equal for both models, or, alternatively, it has to be a shape-only
                                        // model.
    assert(texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) ||
           !texture_triangle_indices
                .empty()); // No texture coordinates are ok. If there are texture
                           // coordinates given, their number needs to be identical to the
                           // number of vertices, or texture_triangle_indices needs to be given.

    const auto num_vertices = shape_instance.rows() / 3;

    core::Mesh mesh;

    // Construct the mesh vertices:
    mesh.vertices.resize(num_vertices);
    for (auto i = 0; i < num_vertices; ++i)
    {
        mesh.vertices[i] = Eigen::Vector3f(
            shape_instance(i * 3 + 0), shape_instance(i * 3 + 1),
            shape_instance(i * 3 + 2)); // Note: This can probably be simplified now, Eigen on both sides!
    }

    // Assign the vertex colour information if it's not a shape-only model:
    if (color_instance.size() > 0)
    {
        mesh.colors.resize(num_vertices);
        for (auto i = 0; i < num_vertices; ++i)
        {
            mesh.colors[i] = Eigen::Vector3f(
                cpp17::clamp(color_instance(i * 3 + 0), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 1), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 2), 0.0f, 1.0f)); // We use RGB order everywhere.
        }
    }

    // Assign the triangle lists:
    mesh.tvi = tvi;
    mesh.tci = tci; // tci will be empty in case of a shape-only model

    // Texture coordinates, if the model has them:
    if (!texture_coordinates.empty())
    {
        mesh.texcoords.resize(texture_coordinates.size());
        for (auto i = 0; i < texture_coordinates.size(); ++i)
        {
            mesh.texcoords[i] = Eigen::Vector2f(texture_coordinates[i][0], texture_coordinates[i][1]);
        }
        if (!texture_triangle_indices.empty())
        {
            mesh.tti = texture_triangle_indices;
        }
    }

    return mesh;
}